

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoModeImpl.cpp
# Opt level: O1

vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *
sf::priv::VideoModeImpl::getFullscreenModes(void)

{
  int iVar1;
  int iVar2;
  Display *display;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *in_RDI;
  int nbDepths;
  int nbSizes;
  Rotation currentRotation;
  VideoMode mode;
  int version;
  int local_68 [2];
  undefined8 local_60;
  undefined1 local_34 [4];
  
  (in_RDI->super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  display = OpenDisplay();
  if (display == (Display *)0x0) {
    poVar5 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "Failed to connect to the X server while trying to get the supported video modes",
               0x4f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  else {
    iVar1 = *(int *)(display + 0xe0);
    iVar2 = XQueryExtension(display,"RANDR",local_34,local_34,local_34);
    if (iVar2 == 0) {
      poVar5 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "Failed to use the XRandR extension while trying to get the supported video modes",
                 0x50);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    else {
      lVar3 = XRRGetScreenInfo(display,*(undefined8 *)
                                        (*(long *)(display + 0xe8) + 0x10 + (long)iVar1 * 0x80));
      if (lVar3 == 0) {
        poVar5 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,
                   "Failed to retrieve the screen configuration while trying to get the supported video modes"
                   ,0x59);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      else {
        lVar4 = XRRConfigSizes(lVar3,local_68);
        if ((lVar4 != 0) && (0 < local_68[0])) {
          local_60 = XListDepths(display,iVar1);
        }
        XRRFreeScreenConfigInfo(lVar3);
      }
    }
    CloseDisplay(display);
  }
  return in_RDI;
}

Assistant:

std::vector<VideoMode> VideoModeImpl::getFullscreenModes()
{
    std::vector<VideoMode> modes;

    // Open a connection with the X server
    Display* display = OpenDisplay();
    if (display)
    {
        // Retrieve the default screen number
        int screen = DefaultScreen(display);

        // Check if the XRandR extension is present
        int version;
        if (XQueryExtension(display, "RANDR", &version, &version, &version))
        {
            // Get the current configuration
            XRRScreenConfiguration* config = XRRGetScreenInfo(display, RootWindow(display, screen));
            if (config)
            {
                // Get the available screen sizes
                int nbSizes;
                XRRScreenSize* sizes = XRRConfigSizes(config, &nbSizes);
                if (sizes && (nbSizes > 0))
                {
                    // Get the list of supported depths
                    int nbDepths = 0;
                    int* depths = XListDepths(display, screen, &nbDepths);
                    if (depths && (nbDepths > 0))
                    {
                        // Combine depths and sizes to fill the array of supported modes
                        for (int i = 0; i < nbDepths; ++i)
                        {
                            for (int j = 0; j < nbSizes; ++j)
                            {
                                // Convert to VideoMode
                                VideoMode mode(sizes[j].width, sizes[j].height, depths[i]);

                                Rotation currentRotation;
                                XRRConfigRotations(config, &currentRotation);

                                if (currentRotation == RR_Rotate_90 || currentRotation == RR_Rotate_270)
                                    std::swap(mode.width, mode.height);

                                // Add it only if it is not already in the array
                                if (std::find(modes.begin(), modes.end(), mode) == modes.end())
                                    modes.push_back(mode);
                            }
                        }

                        // Free the array of depths
                        XFree(depths);
                    }
                }

                // Free the configuration instance
                XRRFreeScreenConfigInfo(config);
            }
            else
            {
                // Failed to get the screen configuration
                err() << "Failed to retrieve the screen configuration while trying to get the supported video modes" << std::endl;
            }
        }
        else
        {
            // XRandr extension is not supported: we cannot get the video modes
            err() << "Failed to use the XRandR extension while trying to get the supported video modes" << std::endl;
        }

        // Close the connection with the X server
        CloseDisplay(display);
    }
    else
    {
        // We couldn't connect to the X server
        err() << "Failed to connect to the X server while trying to get the supported video modes" << std::endl;
    }

    return modes;
}